

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O2

bool Potassco::detail::find_kv(EnumClass *e,StringSpan *sKey,int *iKey,StringSpan *sOut,int *iOut)

{
  int iVar1;
  size_t __n;
  char *pcVar2;
  char cVar3;
  char *pcVar4;
  int local_4c;
  char *local_48;
  int *local_40;
  StringSpan *local_38;
  
  local_4c = e->min;
  pcVar4 = e->rep;
  local_40 = iOut;
  local_38 = sOut;
  while( true ) {
    __n = strcspn(pcVar4," ,=");
    for (local_48 = pcVar4 + __n; cVar3 = *local_48, cVar3 == ' '; local_48 = local_48 + 1) {
    }
    if (cVar3 == '=') {
      Potassco::xconvert(local_48 + 1,&local_4c,&local_48,(int)sOut);
      for (; cVar3 = *local_48, cVar3 == ' '; local_48 = local_48 + 1) {
      }
    }
    pcVar2 = local_48;
    if (((iKey != (int *)0x0) && (local_4c == *iKey)) ||
       ((sKey != (StringSpan *)0x0 &&
        ((sKey->size == __n && (iVar1 = strncmp(pcVar4,sKey->first,__n), iVar1 == 0)))))) break;
    if (cVar3 != ',') {
      return false;
    }
    do {
      pcVar4 = pcVar2 + 1;
      pcVar2 = pcVar2 + 1;
    } while (*pcVar4 == ' ');
    local_4c = local_4c + 1;
    pcVar4 = pcVar2;
  }
  if (local_40 != (int *)0x0) {
    *local_40 = local_4c;
  }
  if (local_38 == (StringSpan *)0x0) {
    return true;
  }
  local_38->first = pcVar4;
  local_38->size = __n;
  return true;
}

Assistant:

bool find_kv(const EnumClass& e, const StringSpan* sKey, const int* iKey, StringSpan* sOut, int* iOut) {
#define SKIPWS(x) while (*(x) == ' ')  ++(x)
	const char* args = e.rep;
	for (int cVal = e.min;; ++cVal) {
		std::size_t s = std::strcspn(args, " ,=");
		const char* v = args + s;
		SKIPWS(v);
		if (*v == '=') { xconvert(v+1, cVal, &v, ','); SKIPWS(v); }
		if ((iKey && cVal == *iKey) || (sKey && sKey->size == s && std::strncmp(args, sKey->first, s) == 0)) {
			if (iOut) { *iOut = cVal; }
			if (sOut) { *sOut = toSpan(args, s); }
			return true;
		}
		if (*(args = v)++ != ',') {
			return false;
		}
		SKIPWS(args);
	}
#undef SKIPWS
}